

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void free_arg_list(JSContext *ctx,JSValue *tab,uint32_t len)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  long lVar4;
  JSValue v;
  
  if (len != 0) {
    lVar4 = 0;
    do {
      iVar2 = *(int64_t *)((long)&tab->tag + lVar4);
      if (0xfffffff4 < (uint)iVar2) {
        JVar3 = (JSValueUnion)((JSValueUnion *)((long)&tab->u + lVar4))->ptr;
        iVar1 = *JVar3.ptr;
        *(int *)JVar3.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          v.tag = iVar2;
          v.u.ptr = JVar3.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)len << 4 != lVar4);
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,tab);
  return;
}

Assistant:

static void free_arg_list(JSContext *ctx, JSValue *tab, uint32_t len)
{
    uint32_t i;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, tab[i]);
    }
    js_free(ctx, tab);
}